

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

String * __thiscall
glcts::LayoutBindingProgram::getErrorLog_abi_cxx11_
          (String *__return_storage_ptr__,LayoutBindingProgram *this,bool dumpShaders)

{
  int iVar1;
  eStageType eVar2;
  ShaderInfo *pSVar3;
  ShaderInfo *pSVar4;
  ProgramInfo *pPVar5;
  ostream *poVar6;
  char *pcVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  String local_3b8;
  String local_398;
  String local_378;
  String local_358;
  String local_338;
  String local_318;
  String local_2f8;
  allocator<char> local_2d1;
  string local_2d0 [8];
  String msg_2;
  ShaderInfo *computeShaderInfo;
  allocator<char> local_261;
  string local_260 [8];
  String msg_1;
  String local_220;
  allocator<char> local_1f9;
  string local_1f8 [8];
  String msg;
  ShaderInfo *vertexShaderInfo;
  ShaderInfo *fragmentShaderInfo;
  undefined1 local_198 [8];
  StringStream errLog;
  bool dumpShaders_local;
  LayoutBindingProgram *this_local;
  
  errLog.super_ostringstream._375_1_ = dumpShaders;
  StringStream::StringStream((StringStream *)local_198);
  iVar1 = (*this->_vptr_LayoutBindingProgram[2])();
  if (iVar1 == 2) {
    pSVar3 = glu::ShaderProgram::getShaderInfo(this->m_program,SHADERTYPE_COMPUTE,0);
    if ((((pSVar3->compileOk & 1U) == 0) ||
        (pPVar5 = glu::ShaderProgram::getProgramInfo(this->m_program), (pPVar5->linkOk & 1U) == 0))
       || ((errLog.super_ostringstream._375_1_ & 1) != 0)) {
      poVar6 = std::operator<<((ostream *)local_198,"### dump of ");
      stageToName_abi_cxx11_((String *)((long)&msg_2.field_2 + 8),this,ComputeShader);
      poVar6 = std::operator<<(poVar6,(string *)(msg_2.field_2._M_local_buf + 8));
      std::operator<<(poVar6,"###\n");
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
      pcVar7 = "Compute shader compile failed while testing ";
      if ((errLog.super_ostringstream._375_1_ & 1) != 0) {
        pcVar7 = "Compute shader should not have compiled";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2d0,pcVar7,&local_2d1);
      std::allocator<char>::~allocator(&local_2d1);
      poVar6 = std::operator<<((ostream *)local_198,local_2d0);
      stageToName_abi_cxx11_(&local_2f8,this,ComputeShader);
      poVar6 = std::operator<<(poVar6,(string *)&local_2f8);
      poVar6 = std::operator<<(poVar6,": ");
      poVar6 = std::operator<<(poVar6,(string *)&pSVar3->infoLog);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string((string *)&local_2f8);
      iVar1 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])
                        (this->m_contextSupplier,2);
      std::operator<<((ostream *)local_198,(string *)CONCAT44(extraout_var_01,iVar1));
      std::__cxx11::string::~string(local_2d0);
    }
  }
  else {
    pSVar3 = glu::ShaderProgram::getShaderInfo(this->m_program,SHADERTYPE_FRAGMENT,0);
    pSVar4 = glu::ShaderProgram::getShaderInfo(this->m_program,SHADERTYPE_VERTEX,0);
    if ((((pSVar3->compileOk & 1U) == 0) ||
        (pPVar5 = glu::ShaderProgram::getProgramInfo(this->m_program), (pPVar5->linkOk & 1U) == 0))
       || ((errLog.super_ostringstream._375_1_ & 1) != 0)) {
      poVar6 = std::operator<<((ostream *)local_198,"### dump of ");
      stageToName_abi_cxx11_((String *)((long)&msg.field_2 + 8),this,FragmentShader);
      poVar6 = std::operator<<(poVar6,(string *)(msg.field_2._M_local_buf + 8));
      std::operator<<(poVar6,"###\n");
      std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
      pcVar7 = "Vertex shader compile failed while testing ";
      if ((errLog.super_ostringstream._375_1_ & 1) != 0) {
        pcVar7 = "Fragment shader should not have compiled";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1f8,pcVar7,&local_1f9);
      std::allocator<char>::~allocator(&local_1f9);
      poVar6 = std::operator<<((ostream *)local_198,"Fragment shader compile failed while testing ")
      ;
      eVar2 = (*this->_vptr_LayoutBindingProgram[2])();
      stageToName_abi_cxx11_(&local_220,this,eVar2);
      poVar6 = std::operator<<(poVar6,(string *)&local_220);
      poVar6 = std::operator<<(poVar6,": ");
      poVar6 = std::operator<<(poVar6,(string *)&pSVar3->infoLog);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string((string *)&local_220);
      iVar1 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])
                        (this->m_contextSupplier,1);
      std::operator<<((ostream *)local_198,(string *)CONCAT44(extraout_var,iVar1));
      std::__cxx11::string::~string(local_1f8);
    }
    if ((((pSVar4->compileOk & 1U) == 0) ||
        (pPVar5 = glu::ShaderProgram::getProgramInfo(this->m_program), (pPVar5->linkOk & 1U) == 0))
       || ((errLog.super_ostringstream._375_1_ & 1) != 0)) {
      poVar6 = std::operator<<((ostream *)local_198,"### dump of ");
      stageToName_abi_cxx11_((String *)((long)&msg_1.field_2 + 8),this,VertexShader);
      poVar6 = std::operator<<(poVar6,(string *)(msg_1.field_2._M_local_buf + 8));
      std::operator<<(poVar6,"###\n");
      std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
      pcVar7 = "Vertex shader compile failed while testing ";
      if ((errLog.super_ostringstream._375_1_ & 1) != 0) {
        pcVar7 = "Vertex shader should not have compiled";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_260,pcVar7,&local_261);
      std::allocator<char>::~allocator(&local_261);
      poVar6 = std::operator<<((ostream *)local_198,local_260);
      eVar2 = (*this->_vptr_LayoutBindingProgram[2])();
      stageToName_abi_cxx11_((String *)&computeShaderInfo,this,eVar2);
      poVar6 = std::operator<<(poVar6,(string *)&computeShaderInfo);
      poVar6 = std::operator<<(poVar6,": ");
      poVar6 = std::operator<<(poVar6,(string *)&pSVar4->infoLog);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string((string *)&computeShaderInfo);
      iVar1 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])
                        (this->m_contextSupplier,0);
      std::operator<<((ostream *)local_198,(string *)CONCAT44(extraout_var_00,iVar1));
      std::__cxx11::string::~string(local_260);
    }
  }
  pPVar5 = glu::ShaderProgram::getProgramInfo(this->m_program);
  if ((pPVar5->linkOk & 1U) == 0) {
    (*this->_vptr_LayoutBindingProgram[2])();
    poVar6 = std::operator<<((ostream *)local_198,"Linking failed while testing ");
    eVar2 = (*this->_vptr_LayoutBindingProgram[2])();
    stageToName_abi_cxx11_(&local_318,this,eVar2);
    poVar6 = std::operator<<(poVar6,(string *)&local_318);
    poVar6 = std::operator<<(poVar6,": ");
    pPVar5 = glu::ShaderProgram::getProgramInfo(this->m_program);
    poVar6 = std::operator<<(poVar6,(string *)pPVar5);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string((string *)&local_318);
    std::operator<<((ostream *)local_198,"### other stages ###\n");
    iVar1 = (*this->_vptr_LayoutBindingProgram[2])();
    if (iVar1 == 0) {
      poVar6 = std::operator<<((ostream *)local_198,"### dump of ");
      stageToName_abi_cxx11_(&local_358,this,FragmentShader);
      poVar6 = std::operator<<(poVar6,(string *)&local_358);
      std::operator<<(poVar6,"###\n");
      std::__cxx11::string::~string((string *)&local_358);
      stageToName_abi_cxx11_(&local_378,this,FragmentShader);
      poVar6 = std::operator<<((ostream *)local_198,(string *)&local_378);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string((string *)&local_378);
      iVar1 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])
                        (this->m_contextSupplier,1);
      std::operator<<((ostream *)local_198,(string *)CONCAT44(extraout_var_03,iVar1));
    }
    else if (iVar1 == 1) {
      poVar6 = std::operator<<((ostream *)local_198,"### dump of ");
      stageToName_abi_cxx11_(&local_338,this,VertexShader);
      poVar6 = std::operator<<(poVar6,(string *)&local_338);
      std::operator<<(poVar6,"###\n");
      std::__cxx11::string::~string((string *)&local_338);
      iVar1 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])
                        (this->m_contextSupplier,0);
      std::operator<<((ostream *)local_198,(string *)CONCAT44(extraout_var_02,iVar1));
    }
    else if (iVar1 == 2) {
      poVar6 = std::operator<<((ostream *)local_198,"### dump of ");
      stageToName_abi_cxx11_(&local_398,this,ComputeShader);
      poVar6 = std::operator<<(poVar6,(string *)&local_398);
      std::operator<<(poVar6,"###\n");
      std::__cxx11::string::~string((string *)&local_398);
      stageToName_abi_cxx11_(&local_3b8,this,ComputeShader);
      poVar6 = std::operator<<((ostream *)local_198,(string *)&local_3b8);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string((string *)&local_3b8);
      iVar1 = (*this->m_contextSupplier->_vptr_IProgramContextSupplier[5])
                        (this->m_contextSupplier,2);
      std::operator<<((ostream *)local_198,(string *)CONCAT44(extraout_var_04,iVar1));
    }
  }
  std::__cxx11::ostringstream::str();
  StringStream::~StringStream((StringStream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

String getErrorLog(bool dumpShaders = false)
	{
		StringStream errLog;

		if (getStage() != ComputeShader)
		{
			const glu::ShaderInfo& fragmentShaderInfo = m_program->getShaderInfo(glu::SHADERTYPE_FRAGMENT);
			const glu::ShaderInfo& vertexShaderInfo   = m_program->getShaderInfo(glu::SHADERTYPE_VERTEX);

			if (!fragmentShaderInfo.compileOk || !m_program->getProgramInfo().linkOk || dumpShaders)
			{
				errLog << "### dump of " << stageToName(FragmentShader) << "###\n";
				String msg((dumpShaders ? "Fragment shader should not have compiled" :
										  "Vertex shader compile failed while testing "));
				errLog << "Fragment shader compile failed while testing " << stageToName(getStage()) << ": "
					   << fragmentShaderInfo.infoLog << "\n";
				errLog << m_contextSupplier.getSource(FragmentShader);
			}
			if (!vertexShaderInfo.compileOk || !m_program->getProgramInfo().linkOk || dumpShaders)
			{
				errLog << "### dump of " << stageToName(VertexShader) << "###\n";
				String msg((dumpShaders ? "Vertex shader should not have compiled" :
										  "Vertex shader compile failed while testing "));
				errLog << msg << stageToName(getStage()) << ": " << vertexShaderInfo.infoLog << "\n";
				errLog << m_contextSupplier.getSource(VertexShader);
			}
		}
		else
		{
			const glu::ShaderInfo& computeShaderInfo = m_program->getShaderInfo(glu::SHADERTYPE_COMPUTE);

			if (!computeShaderInfo.compileOk || !m_program->getProgramInfo().linkOk || dumpShaders)
			{
				errLog << "### dump of " << stageToName(ComputeShader) << "###\n";
				String msg((dumpShaders ? "Compute shader should not have compiled" :
										  "Compute shader compile failed while testing "));
				errLog << msg << stageToName(ComputeShader) << ": " << computeShaderInfo.infoLog << "\n";
				errLog << m_contextSupplier.getSource(ComputeShader);
			}
		}
		if (!m_program->getProgramInfo().linkOk)
		{
			getStage();
			errLog << "Linking failed while testing " << stageToName(getStage()) << ": "
				   << m_program->getProgramInfo().infoLog << "\n";
			errLog << "### other stages ###\n";
			switch (getStage())
			{
			case FragmentShader:
				errLog << "### dump of " << stageToName(VertexShader) << "###\n";
				errLog << m_contextSupplier.getSource(VertexShader);
				break;
			case VertexShader:
				errLog << "### dump of " << stageToName(FragmentShader) << "###\n";
				errLog << stageToName(FragmentShader) << "\n";
				errLog << m_contextSupplier.getSource(FragmentShader);
				break;
			case ComputeShader:
				errLog << "### dump of " << stageToName(ComputeShader) << "###\n";
				errLog << stageToName(ComputeShader) << "\n";
				errLog << m_contextSupplier.getSource(ComputeShader);
				break;
			default:
				DE_ASSERT(0);
				break;
			}
		}
		return errLog.str();
	}